

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O3

void __thiscall chrono::ChForce::SetVrelpoint(ChForce *this,ChVector<double> *myrelpoint)

{
  ChVector<double> *mpoint;
  double dVar1;
  double dVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  ChVector<double> *pCVar6;
  double dVar7;
  double local_48;
  double local_40;
  ChVector<double> local_38;
  
  mpoint = &this->vrelpoint;
  if (mpoint != myrelpoint) {
    (this->vrelpoint).m_data[0] = myrelpoint->m_data[0];
    (this->vrelpoint).m_data[1] = myrelpoint->m_data[1];
    (this->vrelpoint).m_data[2] = myrelpoint->m_data[2];
  }
  ChBody::Point_Body2World(&local_38,this->Body,mpoint);
  pCVar6 = &this->vpoint;
  if (&local_38 != pCVar6) {
    (this->vpoint).m_data[0] = local_38.m_data[0];
    (this->vpoint).m_data[1] = local_38.m_data[1];
    (this->vpoint).m_data[2] = local_38.m_data[2];
  }
  peVar3 = (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = DAT_00b689a0;
  local_48 = DAT_00b689a8;
  dVar7 = VNULL;
  if (peVar3 != (element_type *)0x0) {
    dVar7 = (this->super_ChObj).ChTime;
    (*peVar3->_vptr_ChFunction[4])();
  }
  peVar3 = (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_40 = (this->super_ChObj).ChTime;
    (*peVar3->_vptr_ChFunction[4])();
  }
  peVar3 = (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_48 = (this->super_ChObj).ChTime;
    (*peVar3->_vptr_ChFunction[4])();
  }
  if (this->frame == WORLD) {
    lVar4 = 0x58;
    lVar5 = 0x60;
  }
  else {
    if (this->frame != BODY) {
      return;
    }
    lVar4 = 0x70;
    lVar5 = 0x78;
    pCVar6 = mpoint;
  }
  dVar1 = *(double *)((long)(this->vpoint).m_data + lVar5 + -0x50);
  dVar2 = *(double *)((long)(this->vpoint).m_data + lVar4 + -0x50);
  (this->restpos).m_data[0] = pCVar6->m_data[0] - dVar7;
  (this->restpos).m_data[1] = dVar2 - local_40;
  (this->restpos).m_data[2] = dVar1 - local_48;
  return;
}

Assistant:

void ChForce::SetVrelpoint(ChVector<> myrelpoint) {
    // rel pos
    vrelpoint = myrelpoint;
    // abs pos
    vpoint = GetBody()->Point_Body2World(vrelpoint);

    // computes initial rest position.
    ChVector<> displace = VNULL;
    if (move_x)
        displace.x() = move_x->Get_y(ChTime);
    if (move_y)
        displace.y() = move_y->Get_y(ChTime);
    if (move_z)
        displace.z() = move_z->Get_y(ChTime);

    switch (frame) {
        case WORLD:
            restpos = Vsub(vpoint, displace);
            break;
        case BODY:
            restpos = Vsub(vrelpoint, displace);
            break;
    }
}